

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_item_scheduler.cc
# Opt level: O1

void __thiscall WorkItemScheduler::start(WorkItemScheduler *this)

{
  pointer pWVar1;
  vector<Worker,_std::allocator<Worker>_> *__range1;
  Worker *w;
  pointer this_00;
  thread local_38;
  WorkItemScheduler *local_30;
  code *local_28;
  undefined8 local_20;
  
  this->active_ = true;
  pWVar1 = (this->workers_).super__Vector_base<Worker,_std::allocator<Worker>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->workers_).super__Vector_base<Worker,_std::allocator<Worker>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pWVar1; this_00 = this_00 + 1) {
    Worker::start(this_00);
  }
  local_28 = work_dispatch;
  local_20 = 0;
  local_30 = this;
  std::thread::thread<void(WorkItemScheduler::*)(),WorkItemScheduler*,void>
            (&local_38,(offset_in_WorkItemScheduler_to_subr *)&local_28,&local_30);
  if ((this->dispatcher_thread_)._M_id._M_thread == 0) {
    (this->dispatcher_thread_)._M_id._M_thread = (native_handle_type)local_38._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void WorkItemScheduler::start()
{
    this->active_ = true;

    for (auto& w : this->workers_)
        w.start();

    this->dispatcher_thread_ = std::thread(&WorkItemScheduler::work_dispatch,
                                           this);
}